

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitTruth.c
# Opt level: O0

uint Kit_TruthSemiCanonicize(uint *pInOut,uint *pAux,int nVars,char *pCanonPerm)

{
  undefined1 uVar1;
  byte bVar2;
  bool bVar3;
  uint *puVar4;
  int iVar5;
  int iVar6;
  byte bVar7;
  uint local_dc;
  uint uCanonPhase;
  int nOnes;
  int Counter;
  int fChange;
  int Temp;
  int i;
  int nWords;
  uint *pTemp;
  uint *pOut;
  uint *pIn;
  int pStore [32];
  char *pCanonPerm_local;
  int nVars_local;
  uint *pAux_local;
  uint *pInOut_local;
  
  pStore._120_8_ = pCanonPerm;
  iVar5 = Kit_TruthWordNum(nVars);
  local_dc = 0;
  for (fChange = 0; fChange < nVars; fChange = fChange + 1) {
    *(char *)(pStore._120_8_ + (long)fChange) = (char)fChange;
  }
  iVar6 = Kit_TruthCountOnes(pInOut,nVars);
  if (iVar5 * 0x10 < iVar6) {
    local_dc = 1 << ((byte)nVars & 0x1f);
    Kit_TruthNot(pInOut,pInOut,nVars);
  }
  Kit_TruthCountOnesInCofs(pInOut,nVars,(int *)&pIn);
  for (fChange = 0; fChange < nVars; fChange = fChange + 1) {
    if (pStore[(long)(fChange << 1) + -2] < pStore[(long)(fChange * 2 + 1) + -2]) {
      local_dc = 1 << ((byte)fChange & 0x1f) | local_dc;
      iVar5 = pStore[(long)(fChange << 1) + -2];
      pStore[(long)(fChange << 1) + -2] = pStore[(long)(fChange * 2 + 1) + -2];
      pStore[(long)(fChange * 2 + 1) + -2] = iVar5;
      Kit_TruthChangePhase(pInOut,nVars,fChange);
    }
  }
  bVar2 = 0;
  pTemp = pAux;
  pOut = pInOut;
  do {
    bVar3 = false;
    for (fChange = 0; puVar4 = pOut, fChange < nVars + -1; fChange = fChange + 1) {
      if (pStore[(long)(fChange << 1) + -2] < pStore[(long)((fChange + 1) * 2) + -2]) {
        bVar2 = bVar2 + 1;
        bVar3 = true;
        uVar1 = *(undefined1 *)(pStore._120_8_ + (long)fChange);
        *(undefined1 *)(pStore._120_8_ + (long)fChange) =
             *(undefined1 *)(pStore._120_8_ + (long)(fChange + 1));
        *(undefined1 *)(pStore._120_8_ + (long)(fChange + 1)) = uVar1;
        iVar5 = pStore[(long)(fChange << 1) + -2];
        pStore[(long)(fChange << 1) + -2] = pStore[(long)((fChange + 1) * 2) + -2];
        pStore[(long)((fChange + 1) * 2) + -2] = iVar5;
        iVar5 = pStore[(long)(fChange * 2 + 1) + -2];
        pStore[(long)(fChange * 2 + 1) + -2] = pStore[(long)((fChange + 1) * 2 + 1) + -2];
        pStore[(long)((fChange + 1) * 2 + 1) + -2] = iVar5;
        bVar7 = (byte)fChange;
        if (((local_dc & 1 << (bVar7 & 0x1f)) != 0) != ((local_dc & 1 << (bVar7 + 1 & 0x1f)) != 0))
        {
          local_dc = 1 << (bVar7 + 1 & 0x1f) ^ 1 << (bVar7 & 0x1f) ^ local_dc;
        }
        Kit_TruthSwapAdjacentVars(pTemp,pOut,nVars,fChange);
        pOut = pTemp;
        pTemp = puVar4;
      }
    }
  } while (bVar3);
  if ((bool)(bVar2 & 1)) {
    Kit_TruthCopy(pTemp,pOut,nVars);
  }
  return local_dc;
}

Assistant:

unsigned Kit_TruthSemiCanonicize( unsigned * pInOut, unsigned * pAux, int nVars, char * pCanonPerm )
{
    int pStore[32];
    unsigned * pIn = pInOut, * pOut = pAux, * pTemp;
    int nWords = Kit_TruthWordNum( nVars );
    int i, Temp, fChange, Counter, nOnes;//, k, j, w, Limit;
    unsigned uCanonPhase;

    // canonicize output
    uCanonPhase = 0;
    for ( i = 0; i < nVars; i++ )
        pCanonPerm[i] = i;

    nOnes = Kit_TruthCountOnes(pIn, nVars);
    //if(pIn[0] & 1)
    if ( (nOnes > nWords * 16) )//|| ((nOnes == nWords * 16) && (pIn[0] & 1)) )
    {
        uCanonPhase |= (1 << nVars);
        Kit_TruthNot( pIn, pIn, nVars );
    }

    // collect the minterm counts
    Kit_TruthCountOnesInCofs( pIn, nVars, pStore );
/*
    Kit_TruthCountOnesInCofsSlow( pIn, nVars, pStore2, pAux );
    for ( i = 0; i < 2*nVars; i++ )
    {
        assert( pStore[i] == pStore2[i] );
    }
*/
    // canonicize phase
    for ( i = 0; i < nVars; i++ )
    {
        if ( pStore[2*i+0] >= pStore[2*i+1] )
            continue;
        uCanonPhase |= (1 << i);
        Temp = pStore[2*i+0];
        pStore[2*i+0] = pStore[2*i+1];
        pStore[2*i+1] = Temp;
        Kit_TruthChangePhase( pIn, nVars, i );
    }

//    Kit_PrintHexadecimal( stdout, pIn, nVars );
//    printf( "\n" );

    // permute
    Counter = 0;
    do {
        fChange = 0;
        for ( i = 0; i < nVars-1; i++ )
        {
            if ( pStore[2*i] >= pStore[2*(i+1)] )
                continue;
            Counter++;
            fChange = 1;

            Temp = pCanonPerm[i];
            pCanonPerm[i] = pCanonPerm[i+1];
            pCanonPerm[i+1] = Temp;

            Temp = pStore[2*i];
            pStore[2*i] = pStore[2*(i+1)];
            pStore[2*(i+1)] = Temp;

            Temp = pStore[2*i+1];
            pStore[2*i+1] = pStore[2*(i+1)+1];
            pStore[2*(i+1)+1] = Temp;

            // if the polarity of variables is different, swap them
            if ( ((uCanonPhase & (1 << i)) > 0) != ((uCanonPhase & (1 << (i+1))) > 0) )
            {
                uCanonPhase ^= (1 << i);
                uCanonPhase ^= (1 << (i+1));
            }

            Kit_TruthSwapAdjacentVars( pOut, pIn, nVars, i );
            pTemp = pIn; pIn = pOut; pOut = pTemp;
        }
    } while ( fChange );


/*
    Extra_PrintBinary( stdout, &uCanonPhase, nVars+1 ); printf( " : " );
    for ( i = 0; i < nVars; i++ )
        printf( "%d=%d/%d  ", pCanonPerm[i], pStore[2*i], pStore[2*i+1] );
    printf( "  C = %d\n", Counter );
    Extra_PrintHexadecimal( stdout, pIn, nVars );
    printf( "\n" );
*/

/*
    // process symmetric variable groups
    uSymms = 0;
    for ( i = 0; i < nVars-1; i++ )
    {
        if ( pStore[2*i] != pStore[2*(i+1)] ) // i and i+1 cannot be symmetric
            continue;
        if ( pStore[2*i] != pStore[2*i+1] )
            continue;
        if ( Kit_TruthVarsSymm( pIn, nVars, i, i+1 ) )
            continue;
        if ( Kit_TruthVarsAntiSymm( pIn, nVars, i, i+1 ) )
            Kit_TruthChangePhase( pIn, nVars, i+1 );
    }
*/

/*
    // process symmetric variable groups
    uSymms = 0;
    for ( i = 0; i < nVars-1; i++ )
    {
        if ( pStore[2*i] != pStore[2*(i+1)] ) // i and i+1 cannot be symmetric
            continue;
        // i and i+1 can be symmetric
        // find the end of this group
        for ( k = i+1; k < nVars; k++ )
            if ( pStore[2*i] != pStore[2*k] ) 
                break;
        Limit = k;
        assert( i < Limit-1 );
        // go through the variables in this group
        for ( j = i + 1; j < Limit; j++ )
        {
            // check symmetry
            if ( Kit_TruthVarsSymm( pIn, nVars, i, j ) )
            {
                uSymms |= (1 << j);
                continue;
            }
            // they are phase-unknown
            if ( pStore[2*i] == pStore[2*i+1] ) 
            {
                if ( Kit_TruthVarsAntiSymm( pIn, nVars, i, j ) )
                {
                    Kit_TruthChangePhase( pIn, nVars, j );
                    uCanonPhase ^= (1 << j);
                    uSymms |= (1 << j);
                    continue;
                }
            }

            // they are not symmetric - move j as far as it goes in the group
            for ( k = j; k < Limit-1; k++ )
            {
                Counter++;

                Temp = pCanonPerm[k];
                pCanonPerm[k] = pCanonPerm[k+1];
                pCanonPerm[k+1] = Temp;

                assert( pStore[2*k] == pStore[2*(k+1)] );
                Kit_TruthSwapAdjacentVars( pOut, pIn, nVars, k );
                pTemp = pIn; pIn = pOut; pOut = pTemp;
            }
            Limit--;
            j--;
        }
        i = Limit - 1;
    }
*/

    // swap if it was moved an even number of times
    if ( Counter & 1 )
        Kit_TruthCopy( pOut, pIn, nVars );
    return uCanonPhase;
}